

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

int luv_spawn(lua_State *L)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char **__ptr;
  uv_stdio_container_t *puVar5;
  lua_Integer lVar6;
  uv_stream_t *handle;
  char **ppcVar7;
  uv_process_t *process;
  luv_handle_t *plVar8;
  uv_loop_t *loop;
  uv_stdio_flags uVar9;
  ulong uVar10;
  size_t n;
  long n_00;
  ulong n_01;
  bool bVar11;
  uv_os_fd_t fd;
  uv_process_options_t local_80;
  uv_stdio_container_t *local_40;
  uv_os_fd_t local_34;
  
  local_80.flags = 0;
  local_80.stdio_count = 0;
  local_80.stdio = (uv_stdio_container_t *)0x0;
  local_80.env = (char **)0x0;
  local_80.cwd = (char *)0x0;
  local_80.uid = 0;
  local_80.gid = 0;
  local_80.exit_cb = exit_cb;
  pcVar3 = luaL_checklstring(L,1,(size_t *)0x0);
  local_80._40_8_ = local_80._40_8_ & 0xffffffff00000000;
  local_80.file = pcVar3;
  luaL_checktype(L,2,5);
  lua_getfield(L,2,"args");
  iVar2 = lua_type(L,-1);
  if (iVar2 == 5) {
    sVar4 = lua_rawlen(L,-1);
    uVar10 = sVar4 + 1;
  }
  else {
    iVar2 = lua_type(L,-1);
    if (iVar2 != 0) {
      pcVar3 = "args option must be table";
      iVar2 = 3;
      goto LAB_0014a7c9;
    }
    uVar10 = 1;
  }
  __ptr = (char **)malloc(uVar10 * 8 + 8);
  local_80.args = __ptr;
  if (__ptr == (char **)0x0) {
    pcVar3 = "Problem allocating args";
LAB_0014a92a:
    iVar2 = luaL_error(L,pcVar3);
    return iVar2;
  }
  *__ptr = pcVar3;
  if (1 < uVar10) {
    n_01 = 1;
    do {
      lua_rawgeti(L,-1,n_01);
      pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
      __ptr[n_01] = pcVar3;
      lua_settop(L,-2);
      n_01 = n_01 + 1;
    } while (uVar10 != n_01);
  }
  __ptr[uVar10] = (char *)0x0;
  lua_settop(L,-2);
  lua_getfield(L,2,"stdio");
  iVar2 = lua_type(L,-1);
  if (iVar2 == 5) {
    sVar4 = lua_rawlen(L,-1);
    local_80.stdio_count = (int)sVar4;
    puVar5 = (uv_stdio_container_t *)malloc(sVar4 << 4);
    local_80.stdio = puVar5;
    local_40 = puVar5;
    if (puVar5 == (uv_stdio_container_t *)0x0) {
      free(__ptr);
      pcVar3 = "Problem allocating stdio";
      goto LAB_0014a92a;
    }
    if (sVar4 != 0) {
      n = 1;
      do {
        lua_rawgeti(L,-1,n);
        iVar2 = lua_type(L,-1);
        if (iVar2 == 3) {
          puVar5->flags = UV_INHERIT_FD;
          lVar6 = lua_tointegerx(L,-1,(int *)0x0);
          (puVar5->data).fd = (int)lVar6;
        }
        else {
          iVar2 = lua_type(L,-1);
          if (iVar2 == 7) {
            handle = luv_check_stream(L,-1);
            iVar2 = uv_fileno((uv_handle_t *)handle,&local_34);
            if (((iVar2 == -9) || (uVar9 = UV_INHERIT_STREAM, iVar2 == -0x16)) &&
               (uVar9 = (uint)(n - 4 < 0xfffffffffffffffe) << 4 | (UV_WRITABLE_PIPE|UV_CREATE_PIPE),
               n == 1)) {
              uVar9 = UV_READABLE_PIPE|UV_CREATE_PIPE;
            }
            puVar5->flags = uVar9;
            (puVar5->data).stream = handle;
          }
          else {
            iVar2 = lua_type(L,-1);
            if (iVar2 != 0) {
              free(__ptr);
              free(local_40);
              free(local_80.env);
              pcVar3 = "stdio table entries must be nil, uv_stream_t, or integer";
              goto LAB_0014abf1;
            }
            puVar5->flags = UV_IGNORE;
          }
        }
        lua_settop(L,-2);
        puVar5 = puVar5 + 1;
        bVar11 = n != sVar4;
        n = n + 1;
      } while (bVar11);
    }
  }
  else {
    iVar2 = lua_type(L,-1);
    if (iVar2 != 0) {
      free(__ptr);
      pcVar3 = "stdio option must be table";
      iVar2 = 2;
LAB_0014a7c9:
      iVar2 = luaL_argerror(L,iVar2,pcVar3);
      return iVar2;
    }
  }
  lua_settop(L,-2);
  lua_getfield(L,2,"env");
  iVar2 = lua_type(L,-1);
  if (iVar2 == 5) {
    sVar4 = lua_rawlen(L,-1);
    ppcVar7 = (char **)malloc(sVar4 * 8 + 8);
    local_80.env = ppcVar7;
    if (ppcVar7 == (char **)0x0) {
      free(__ptr);
      free(local_80.stdio);
      iVar2 = luaL_error(L,"Problem allocating env");
      return iVar2;
    }
    if (sVar4 != 0) {
      n_00 = 1;
      do {
        lua_rawgeti(L,-1,n_00);
        pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
        ppcVar7[n_00 + -1] = pcVar3;
        lua_settop(L,-2);
        lVar1 = n_00 + 1;
        n_00 = n_00 + 1;
      } while (lVar1 - sVar4 != 1);
    }
    ppcVar7[sVar4] = (char *)0x0;
LAB_0014a8d2:
    lua_settop(L,-2);
    lua_getfield(L,2,"cwd");
    iVar2 = lua_type(L,-1);
    if (iVar2 == 4) {
      local_80.cwd = lua_tolstring(L,-1,(size_t *)0x0);
    }
    else {
      iVar2 = lua_type(L,-1);
      if (iVar2 != 0) {
        free(__ptr);
        free(local_80.stdio);
        free(local_80.env);
        pcVar3 = "cwd option must be string";
        goto LAB_0014abf1;
      }
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"uid");
    iVar2 = lua_type(L,-1);
    if (iVar2 == 3) {
      lVar6 = lua_tointegerx(L,-1,(int *)0x0);
      local_80.uid = (uv_uid_t)lVar6;
      local_80._40_8_ = local_80._40_8_ | 1;
    }
    else {
      iVar2 = lua_type(L,-1);
      if (iVar2 != 0) {
        free(__ptr);
        free(local_80.stdio);
        free(local_80.env);
        pcVar3 = "uid option must be number";
        goto LAB_0014abf1;
      }
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"gid");
    iVar2 = lua_type(L,-1);
    if (iVar2 == 3) {
      lVar6 = lua_tointegerx(L,-1,(int *)0x0);
      local_80.gid = (uv_gid_t)lVar6;
      local_80._40_8_ = local_80._40_8_ | 2;
    }
    else {
      iVar2 = lua_type(L,-1);
      if (iVar2 != 0) {
        luv_clean_options(&local_80);
        pcVar3 = "gid option must be number";
        goto LAB_0014abf1;
      }
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"verbatim");
    iVar2 = lua_toboolean(L,-1);
    if (iVar2 != 0) {
      local_80._40_8_ = local_80._40_8_ | 4;
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"detached");
    iVar2 = lua_toboolean(L,-1);
    if (iVar2 != 0) {
      local_80._40_8_ = local_80._40_8_ | 8;
    }
    lua_settop(L,-2);
    lua_getfield(L,2,"hide");
    iVar2 = lua_toboolean(L,-1);
    if (iVar2 != 0) {
      local_80._40_8_ = local_80._40_8_ | 0x10;
    }
    lua_settop(L,-2);
    process = (uv_process_t *)luv_newuserdata(L,0x88);
    process->type = UV_PROCESS;
    plVar8 = luv_setup_handle(L);
    process->data = plVar8;
    iVar2 = lua_type(L,3);
    if (0 < iVar2) {
      luv_check_callback(L,(luv_handle_t *)process->data,1,3);
    }
    loop = luv_loop(L);
    iVar2 = uv_spawn(loop,process,&local_80);
    free(local_80.args);
    free(local_80.stdio);
    free(local_80.env);
    if (iVar2 < 0) {
      uv_close((uv_handle_t *)process,luv_spawn_close_cb);
      luv_error(L,iVar2);
      iVar2 = 3;
    }
    else {
      lua_pushinteger(L,(long)process->pid);
      iVar2 = 2;
    }
  }
  else {
    iVar2 = lua_type(L,-1);
    if (iVar2 == 0) goto LAB_0014a8d2;
    free(__ptr);
    free(local_80.stdio);
    free(local_80.env);
    pcVar3 = "env option must be table";
LAB_0014abf1:
    iVar2 = luaL_argerror(L,2,pcVar3);
  }
  return iVar2;
}

Assistant:

static int luv_spawn(lua_State* L) {
  uv_process_t* handle;
  uv_process_options_t options;
  size_t i, len = 0;
  int ret;
  luv_ctx_t* ctx = luv_context(L);

  memset(&options, 0, sizeof(options));
  options.exit_cb = exit_cb;
  options.file = luaL_checkstring(L, 1);
  options.flags = 0;

  // Make sure the 2nd argument is a table
  luaL_checktype(L, 2, LUA_TTABLE);

  // get the args list
  lua_getfield(L, 2, "args");
  // +1 for inserted command at front
  if (lua_type(L, -1) == LUA_TTABLE) {
    len = 1 + lua_rawlen(L, -1);
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 3, "args option must be table");
  }
  else {
    len = 1;
  }
  // +1 for null terminator at end
  options.args = (char**)malloc((len + 1) * sizeof(*options.args));
  if (!options.args) {
    luv_clean_options(&options);
    return luaL_error(L, "Problem allocating args");
  }
  options.args[0] = (char*)options.file;
  for (i = 1; i < len; ++i) {
    lua_rawgeti(L, -1, i);
    options.args[i] = (char*)lua_tostring(L, -1);
    lua_pop(L, 1);
  }
  options.args[len] = NULL;
  lua_pop(L, 1);

  // get the stdio list
  lua_getfield(L, 2, "stdio");
  if (lua_type(L, -1) == LUA_TTABLE) {
    options.stdio_count = len = sparse_rawlen(L, -1);
    options.stdio = (uv_stdio_container_t*)malloc(len * sizeof(*options.stdio));
    if (!options.stdio) {
      luv_clean_options(&options);
      return luaL_error(L, "Problem allocating stdio");
    }
    for (i = 0; i < len; ++i) {
      lua_rawgeti(L, -1, i + 1);
      // integers are assumed to be file descripters
      if (lua_type(L, -1) == LUA_TNUMBER) {
        options.stdio[i].flags = UV_INHERIT_FD;
        options.stdio[i].data.fd = lua_tointeger(L, -1);
      }
      // userdata is assumed to be a uv_stream_t instance
      else if (lua_type(L, -1) == LUA_TUSERDATA) {
        uv_os_fd_t fd;
        uv_stream_t* stream = luv_check_stream(L, -1);
        int err = uv_fileno((uv_handle_t*)stream, &fd);
        if (err == UV_EINVAL || err == UV_EBADF) {
          // stdin (fd 0) is read-only, stdout and stderr (fds 1 & 2) are
          // write-only, and all fds > 2 are read-write
          int flags = UV_CREATE_PIPE;
          if (i == 0 || i > 2)
            flags |= UV_READABLE_PIPE;
          if (i != 0)
            flags |= UV_WRITABLE_PIPE;
          options.stdio[i].flags = (uv_stdio_flags)flags;
        }
        else {
          options.stdio[i].flags = UV_INHERIT_STREAM;
        }
        options.stdio[i].data.stream = stream;
      }
      else if (lua_type(L, -1) == LUA_TNIL) {
        options.stdio[i].flags = UV_IGNORE;
      }
      else {
        luv_clean_options(&options);
        return luaL_argerror(L, 2, "stdio table entries must be nil, uv_stream_t, or integer");
      }
      lua_pop(L, 1);
    }
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 2, "stdio option must be table");
  }
  lua_pop(L, 1);

  // Get the env
  lua_getfield(L, 2, "env");
  if (lua_type(L, -1) == LUA_TTABLE) {
    len = lua_rawlen(L, -1);
    options.env = (char**)malloc((len + 1) * sizeof(*options.env));
    if (!options.env) {
      luv_clean_options(&options);
      return luaL_error(L, "Problem allocating env");
    }
    for (i = 0; i < len; ++i) {
      lua_rawgeti(L, -1, i + 1);
      options.env[i] = (char*)lua_tostring(L, -1);
      lua_pop(L, 1);
    }
    options.env[len] = NULL;
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 2, "env option must be table");
  }
  lua_pop(L, 1);

  // Get the cwd
  lua_getfield(L, 2, "cwd");
  if (lua_type(L, -1) == LUA_TSTRING) {
    options.cwd = (char*)lua_tostring(L, -1);
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 2, "cwd option must be string");
  }
  lua_pop(L, 1);

  // Check for uid
  lua_getfield(L, 2, "uid");
  if (lua_type(L, -1) == LUA_TNUMBER) {
    options.uid = lua_tointeger(L, -1);
    options.flags |= UV_PROCESS_SETUID;
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 2, "uid option must be number");
  }
  lua_pop(L, 1);

  // Check for gid
  lua_getfield(L, 2, "gid");
  if (lua_type(L, -1) == LUA_TNUMBER) {
    options.gid = lua_tointeger(L, -1);
    options.flags |= UV_PROCESS_SETGID;
  }
  else if (lua_type(L, -1) != LUA_TNIL) {
    luv_clean_options(&options);
    return luaL_argerror(L, 2, "gid option must be number");
  }
  lua_pop(L, 1);

  // Check for the boolean flags
  lua_getfield(L, 2, "verbatim");
  if (lua_toboolean(L, -1)) {
    options.flags |= UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS;
  }
  lua_pop(L, 1);
  lua_getfield(L, 2, "detached");
  if (lua_toboolean(L, -1)) {
    options.flags |= UV_PROCESS_DETACHED;
  }
  lua_pop(L, 1);
  lua_getfield(L, 2, "hide");
  if (lua_toboolean(L, -1)) {
    options.flags |= UV_PROCESS_WINDOWS_HIDE;
  }
  lua_pop(L, 1);
#if LUV_UV_VERSION_GEQ(1, 24, 0)
  lua_getfield(L, 2, "hide_console");
  if (lua_toboolean(L, -1)) {
    options.flags |= UV_PROCESS_WINDOWS_HIDE_CONSOLE;
  }
  lua_pop(L, 1);
  lua_getfield(L, 2, "hide_gui");
  if (lua_toboolean(L, -1)) {
    options.flags |= UV_PROCESS_WINDOWS_HIDE_GUI;
  }
  lua_pop(L, 1);
#endif

  // this will fill the 3rd argument with nil if it doesn't exist so that
  // the uv_process_t userdata doesn't get treated as the 3rd argument
  lua_settop(L, 3);

  handle = (uv_process_t*)luv_newuserdata(L, sizeof(*handle));
  handle->type = UV_PROCESS;
  handle->data = luv_setup_handle(L, ctx);

  if (!lua_isnoneornil(L, 3)) {
    luv_check_callback(L, (luv_handle_t*)handle->data, LUV_EXIT, 3);
  }

  ret = uv_spawn(ctx->loop, handle, &options);

  luv_clean_options(&options);
  if (ret < 0) {
    /* The async callback is required here because luajit GC may reclaim the
     * luv handle before libuv is done closing it down.
     */
    uv_close((uv_handle_t*)handle, luv_spawn_close_cb);
    return luv_error(L, ret);
  }
  lua_pushinteger(L, handle->pid);
  return 2;
}